

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::AnyMetadata::InternalPackFrom
          (AnyMetadata *this,MessageLite *message,StringPiece type_url_prefix,StringPiece type_name)

{
  StringPiece type_url_prefix_00;
  StringPiece message_name;
  MessageLite *in_RSI;
  string *in_RDI;
  char *in_stack_00000080;
  string *default_value;
  string *in_stack_ffffffffffffff50;
  ArenaStringPtr *this_00;
  string local_50 [32];
  MessageLite *local_30;
  
  this_00 = *(ArenaStringPtr **)in_RDI;
  local_30 = in_RSI;
  GetEmptyString_abi_cxx11_();
  message_name.length_ = (stringpiece_ssize_type)type_name.ptr_;
  message_name.ptr_ = (char *)this;
  type_url_prefix_00.length_ = (stringpiece_ssize_type)message;
  type_url_prefix_00.ptr_ = in_stack_00000080;
  GetTypeUrl_abi_cxx11_(message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(this_00,in_RDI,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(local_50);
  default_value = (string *)in_RDI->_M_string_length;
  GetEmptyStringAlreadyInited_abi_cxx11_();
  ArenaStringPtr::MutableNoArena((ArenaStringPtr *)local_30,default_value);
  MessageLite::SerializeToString(local_30,default_value);
  return;
}

Assistant:

void AnyMetadata::InternalPackFrom(const MessageLite& message,
                                   StringPiece type_url_prefix,
                                   StringPiece type_name) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(type_name, type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}